

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populationTest.cpp
# Opt level: O0

int main(void)

{
  allocator<char> *__a;
  SpikeEvent *this;
  Clock *this_00;
  void *pvVar1;
  reference ppEVar2;
  int i;
  Clock *clock;
  Event *e;
  SpikingPopulation *p2;
  SpikingPopulation *p1;
  allocator<char> *paVar3;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar4;
  undefined8 in_stack_ffffffffffffff78;
  SpikingPopulation *in_stack_ffffffffffffff80;
  allocator<char> local_71;
  string local_70 [32];
  SpikeEvent *local_50;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30 [32];
  allocator<char> *local_10;
  undefined4 local_4;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_4 = 0;
  __a = (allocator<char> *)operator_new(0x60);
  local_45 = 1;
  paVar3 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),(char *)paVar3,__a);
  SpikingPopulation::SpikingPopulation
            (in_stack_ffffffffffffff80,iVar4,
             (string *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_45 = 0;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  local_10 = __a;
  this = (SpikeEvent *)operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),(char *)paVar3,__a);
  SpikingPopulation::SpikingPopulation
            (in_stack_ffffffffffffff80,iVar4,
             (string *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_50 = this;
  operator_new(0x18);
  NoEvent::NoEvent((NoEvent *)this);
  this_00 = Clock::getInstance();
  Clock::setDt(this_00,0.01);
  for (iVar4 = 0; iVar4 < 1000; iVar4 = iVar4 + 1) {
    Clock::tick(this_00);
    if (iVar4 == 100) {
      pvVar1 = operator_new(0x28);
      SpikeEvent::SpikeEvent(this);
      *(undefined4 *)((long)pvVar1 + 0x18) = 1;
      *(undefined8 *)((long)pvVar1 + 0x20) = 0x3ff0000000000000;
    }
    else if (iVar4 == 600) {
      operator_new(0x18);
      NoEvent::NoEvent((NoEvent *)this);
    }
    (**(local_50->super_Event)._vptr_Event)();
    paVar3 = local_10;
    ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)&(local_50->super_Event).type,
                         0);
    (**(code **)(*(long *)paVar3 + 0x28))(paVar3,0,*ppEVar2);
    (*(code *)**(undefined8 **)local_10)();
  }
  return 0;
}

Assistant:

int main() 
{
    SpikingPopulation* p1 = new SpikingPopulation(1, "izhikevich");
    SpikingPopulation* p2 = new SpikingPopulation(1, "CurrentGenerator");

    Event* e = new NoEvent();

    Clock* clock = Clock::getInstance();
    clock->setDt(0.01);

    for(int i = 0; i < 1000; i++) {
        clock->tick();
        if(i == 100) {
            e = new SpikeEvent();
            static_cast<SpikeEvent*>(e)->multiplicity = 1;
            static_cast<SpikeEvent*>(e)->weight = 1.0;
        }
        else if(i == 600) {
            e = new NoEvent();
        }
        p2->update();

        p1->setInput(0, p2->output[0]);
        p1->update();

    }
    return 0;
}